

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

ES5HeapArgumentsObject * __thiscall
Js::HeapArgumentsObject::ConvertToES5HeapArgumentsObject
          (HeapArgumentsObject *this,bool overwriteArgsUsingFrameObject)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  INT_PTR *pIVar5;
  undefined4 *puVar6;
  Var value;
  uint32 i;
  uint index;
  
  BVar4 = CrossSite::IsCrossSiteObjectTyped<Js::HeapArgumentsObject>(this);
  pp_Var1 = (this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  if (BVar4 == 0) {
    if (pp_Var1 == (_func_int **)VirtualTableInfo<Js::HeapArgumentsObject>::Address) {
      pIVar5 = &VirtualTableInfo<Js::ES5HeapArgumentsObject>::Address;
      goto LAB_009f7fe6;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x122,
                                "(VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this))",
                                "VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this)");
    if (!bVar3) goto LAB_009f8049;
    pIVar5 = &VirtualTableInfo<Js::ES5HeapArgumentsObject>::Address;
  }
  else {
    if (pp_Var1 ==
        (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::HeapArgumentsObject>_>::Address) {
      pIVar5 = &VirtualTableInfo<Js::CrossSiteObject<Js::ES5HeapArgumentsObject>_>::Address;
      goto LAB_009f7fe6;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x127,
                                "(VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this))"
                                ,
                                "VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this)"
                               );
    if (!bVar3) {
LAB_009f8049:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pIVar5 = &VirtualTableInfo<Js::CrossSiteObject<Js::ES5HeapArgumentsObject>_>::Address;
  }
  *puVar6 = 0;
LAB_009f7fe6:
  (this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)*pIVar5;
  if (overwriteArgsUsingFrameObject) {
    for (index = 0;
        (index < this->formalCount && (index < (*(uint *)&this->field_0x20 & 0x7fffffff)));
        index = index + 1) {
      BVar4 = IsArgumentDeleted(this,index);
      if (BVar4 == 0) {
        value = DynamicObject::GetSlot(&((this->frameObject).ptr)->super_DynamicObject,index);
        DynamicObject::SetObjectArrayItem((DynamicObject *)this,index,value,PropertyOperation_None);
      }
    }
  }
  return (ES5HeapArgumentsObject *)this;
}

Assistant:

ES5HeapArgumentsObject* HeapArgumentsObject::ConvertToES5HeapArgumentsObject(bool overwriteArgsUsingFrameObject)
    {
        if (!CrossSite::IsCrossSiteObjectTyped(this))
        {
            Assert(VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this));
            VirtualTableInfo<ES5HeapArgumentsObject>::SetVirtualTable(this);
        }
        else
        {
            Assert(VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this));
            VirtualTableInfo<CrossSiteObject<ES5HeapArgumentsObject>>::SetVirtualTable(this);
        }

        ES5HeapArgumentsObject* es5This = static_cast<ES5HeapArgumentsObject*>(this);

        if (overwriteArgsUsingFrameObject)
        {
            // Copy existing items to the array so that they are there before the user can call Object.preventExtensions,
            // after which we can no longer add new items to the objectArray.
            for (uint32 i = 0; i < this->formalCount && i < this->numOfArguments; ++i)
            {
                AssertMsg(this->IsFormalArgument(i), "this->IsFormalArgument(i)");
                if (!this->IsArgumentDeleted(i))
                {
                    // At this time the value doesn't matter, use one from slots.
                    this->SetObjectArrayItem(i, this->frameObject->GetSlot(i), PropertyOperation_None);
                }
            }
        }
        return es5This;

    }